

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

int SimpleLoggerMgr::getTzGap(void)

{
  tm *ptVar1;
  tm *ptVar2;
  time_t raw_time;
  tm new_time;
  long local_50;
  tm local_48;
  
  local_50 = std::chrono::_V2::system_clock::now();
  local_50 = local_50 / 1000000000;
  ptVar1 = localtime_r(&local_50,&local_48);
  ptVar2 = gmtime(&local_50);
  return (ptVar1->tm_min - ptVar2->tm_min) + (ptVar1->tm_mday - ptVar2->tm_mday) * 0x5a0 +
         (ptVar1->tm_hour - ptVar2->tm_hour) * 0x3c;
}

Assistant:

int SimpleLoggerMgr::getTzGap() {
    std::chrono::system_clock::time_point now =
        std::chrono::system_clock::now();
    std::time_t raw_time = std::chrono::system_clock::to_time_t(now);
    std::tm new_time;

#if defined(__linux__) || defined(__APPLE__)
    std::tm* lt_tm = localtime_r(&raw_time, &new_time);
    std::tm* gmt_tm = std::gmtime(&raw_time);

#elif defined(WIN32) || defined(_WIN32)
    localtime_s(&new_time, &raw_time);
    std::tm* lt_tm = &new_time;
    std::tm new_gmt_time;
    gmtime_s(&new_gmt_time, &raw_time);
    std::tm* gmt_tm = &new_gmt_time;
#endif

    TimeInfo lt(lt_tm);
    TimeInfo gmt(gmt_tm);

    return ( (  lt.day * 60 * 24 +  lt.hour * 60 +  lt.min ) -
             ( gmt.day * 60 * 24 + gmt.hour * 60 + gmt.min ) );
}